

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void expand_suite::expand_back_back_1(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  basic_iterator<int> first_end_05;
  basic_iterator<int> first_end_06;
  basic_iterator<int> first_end_07;
  basic_iterator<int> first_end_08;
  basic_iterator<int> first_end_09;
  basic_iterator<int> first_end_10;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  basic_iterator<int> first_begin_05;
  basic_iterator<int> first_begin_06;
  basic_iterator<int> first_begin_07;
  basic_iterator<int> first_begin_08;
  basic_iterator<int> first_begin_09;
  basic_iterator<int> first_begin_10;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_141;
  vector<int,_std::allocator<int>_> local_140;
  circular_view<int,_18446744073709551615UL> local_128;
  int local_108 [4];
  circular_view<int,_18446744073709551615UL> *local_f8;
  size_type sStack_f0;
  circular_view<int,_18446744073709551615UL> *local_e8;
  size_type sStack_e0;
  circular_view<int,_18446744073709551615UL> *local_d8;
  size_type sStack_d0;
  circular_view<int,_18446744073709551615UL> *local_c8;
  size_type sStack_c0;
  circular_view<int,_18446744073709551615UL> *local_b8;
  size_type sStack_b0;
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  type local_38 [4];
  
  local_128.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_128.member.cap = 4;
  local_128.member.size = 0;
  local_128.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_128);
  *piVar2 = 0xb;
  local_108[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_40 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_40 = local_128.member.next % uVar1;
  }
  first_end.current = sStack_40;
  first_end.parent = &local_128;
  first_begin.current = uVar4;
  first_begin.parent = &local_128;
  local_48 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb70,"void expand_suite::expand_back_back_1()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  local_108[0] = 0xb;
  local_108[1] = 0;
  __l_00._M_len = 2;
  __l_00._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_00,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_50 = local_128.member.next % uVar1;
  }
  first_end_00.current = sStack_50;
  first_end_00.parent = &local_128;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_128;
  local_58 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb78,"void expand_suite::expand_back_back_1()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_128);
  *piVar2 = 0x16;
  local_108[0] = 0xb;
  local_108[1] = 0;
  local_108[2] = 0x16;
  __l_01._M_len = 3;
  __l_01._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_01,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_60 = local_128.member.next % uVar1;
  }
  first_end_01.current = sStack_60;
  first_end_01.parent = &local_128;
  first_begin_01.current = uVar4;
  first_begin_01.parent = &local_128;
  local_68 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb80,"void expand_suite::expand_back_back_1()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  local_108[0] = 0xb;
  local_108[1] = 0;
  local_108[2] = 0x16;
  local_108[3] = 0;
  __l_02._M_len = 4;
  __l_02._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_02,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_70 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_70 = local_128.member.next % uVar1;
  }
  first_end_02.current = sStack_70;
  first_end_02.parent = &local_128;
  first_begin_02.current = uVar4;
  first_begin_02.parent = &local_128;
  local_78 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb88,"void expand_suite::expand_back_back_1()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_128);
  *piVar2 = 0x21;
  local_108[0] = 0;
  local_108[1] = 0x16;
  local_108[2] = 0;
  local_108[3] = 0x21;
  __l_03._M_len = 4;
  __l_03._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_03,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_80 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_80 = local_128.member.next % uVar1;
  }
  first_end_03.current = sStack_80;
  first_end_03.parent = &local_128;
  first_begin_03.current = uVar4;
  first_begin_03.parent = &local_128;
  local_88 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb90,"void expand_suite::expand_back_back_1()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  local_108[0] = 0x16;
  local_108[1] = 0;
  local_108[2] = 0x21;
  local_108[3] = 0;
  __l_04._M_len = 4;
  __l_04._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_04,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_90 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_90 = local_128.member.next % uVar1;
  }
  first_end_04.current = sStack_90;
  first_end_04.parent = &local_128;
  first_begin_04.current = uVar4;
  first_begin_04.parent = &local_128;
  local_98 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb98,"void expand_suite::expand_back_back_1()",first_begin_04,first_end_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_128);
  *piVar2 = 0x2c;
  local_108[0] = 0;
  local_108[1] = 0x21;
  local_108[2] = 0;
  local_108[3] = 0x2c;
  __l_05._M_len = 4;
  __l_05._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_05,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_a0 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_a0 = local_128.member.next % uVar1;
  }
  first_end_05.current = sStack_a0;
  first_end_05.parent = &local_128;
  first_begin_05.current = uVar4;
  first_begin_05.parent = &local_128;
  local_a8 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xba0,"void expand_suite::expand_back_back_1()",first_begin_05,first_end_05,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  local_108[0] = 0x21;
  local_108[1] = 0;
  local_108[2] = 0x2c;
  local_108[3] = 0;
  __l_06._M_len = 4;
  __l_06._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_06,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_b0 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_b0 = local_128.member.next % uVar1;
  }
  first_end_06.current = sStack_b0;
  first_end_06.parent = &local_128;
  first_begin_06.current = uVar4;
  first_begin_06.parent = &local_128;
  local_b8 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xba8,"void expand_suite::expand_back_back_1()",first_begin_06,first_end_06,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_128);
  *piVar2 = 0x37;
  local_108[0] = 0;
  local_108[1] = 0x2c;
  local_108[2] = 0;
  local_108[3] = 0x37;
  __l_07._M_len = 4;
  __l_07._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_07,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_c0 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_c0 = local_128.member.next % uVar1;
  }
  first_end_07.current = sStack_c0;
  first_end_07.parent = &local_128;
  first_begin_07.current = uVar4;
  first_begin_07.parent = &local_128;
  local_c8 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xbb0,"void expand_suite::expand_back_back_1()",first_begin_07,first_end_07,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  local_108[0] = 0x2c;
  local_108[1] = 0;
  local_108[2] = 0x37;
  local_108[3] = 0;
  __l_08._M_len = 4;
  __l_08._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_08,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_d0 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_d0 = local_128.member.next % uVar1;
  }
  first_end_08.current = sStack_d0;
  first_end_08.parent = &local_128;
  first_begin_08.current = uVar4;
  first_begin_08.parent = &local_128;
  local_d8 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,3000,"void expand_suite::expand_back_back_1()",first_begin_08,first_end_08,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_128);
  *piVar2 = 0x42;
  local_108[0] = 0;
  local_108[1] = 0x37;
  local_108[2] = 0;
  local_108[3] = 0x42;
  __l_09._M_len = 4;
  __l_09._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_09,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_e0 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_e0 = local_128.member.next % uVar1;
  }
  first_end_09.current = sStack_e0;
  first_end_09.parent = &local_128;
  first_begin_09.current = uVar4;
  first_begin_09.parent = &local_128;
  local_e8 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xbc0,"void expand_suite::expand_back_back_1()",first_begin_09,first_end_09,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_128,1);
  local_108[0] = 0x37;
  local_108[1] = 0;
  local_108[2] = 0x42;
  local_108[3] = 0;
  __l_10._M_len = 4;
  __l_10._M_array = local_108;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_10,&local_141);
  uVar1 = local_128.member.cap * 2;
  uVar3 = uVar1 - (local_128.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_128.member.next - local_128.member.size;
  }
  else {
    uVar4 = (local_128.member.next - local_128.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_f0 = uVar1 - 1 & local_128.member.next;
  }
  else {
    sStack_f0 = local_128.member.next % uVar1;
  }
  first_end_10.current = sStack_f0;
  first_end_10.parent = &local_128;
  first_begin_10.current = uVar4;
  first_begin_10.parent = &local_128;
  local_f8 = &local_128;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xbc8,"void expand_suite::expand_back_back_1()",first_begin_10,first_end_10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_back_back_1()
{
    int array[4] = {};
    circular_view<int> span(array);
    // 11 XX XX XX
    // <>
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 XX XX XX
    // <--->
    span.expand_back(1);
    {
        std::vector<int> expect = { 11, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 XX 22 XX
    // <------>
    span.push_back(22);
    {
        std::vector<int> expect = { 11, 0, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 XX 22 XX
    // <--------->
    span.expand_back(1);
    {
        std::vector<int> expect = { 11, 0, 22, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 33 XX 22 XX
    // -> <-------
    span.push_back(33);
    {
        std::vector<int> expect = { 0, 22, 0, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 33 XX 22 XX
    // ----> <----
    span.expand_back(1);
    {
        std::vector<int> expect = { 22, 0, 33, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 33 XX 44 XX
    // -------> <-
    span.push_back(44);
    {
        std::vector<int> expect = { 0, 33, 0, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 33 XX 44 XX
    // <--------->
    span.expand_back(1);
    {
        std::vector<int> expect = { 33, 0, 44, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 55 XX 44 XX
    // -> <-------
    span.push_back(55);
    {
        std::vector<int> expect = { 0, 44, 0, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 55 XX 44 XX
    // ----> <----
    span.expand_back(1);
    {
        std::vector<int> expect = { 44, 0, 55, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 55 XX 66 XX
    // -------> <-
    span.push_back(66);
    {
        std::vector<int> expect = { 0, 55, 0, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 55 XX 66 XX
    // <--------->
    span.expand_back(1);
    {
        std::vector<int> expect = { 55, 0, 66, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}